

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O0

void __thiscall
StripAnsiEscapeCodesStripColors::~StripAnsiEscapeCodesStripColors
          (StripAnsiEscapeCodesStripColors *this)

{
  StripAnsiEscapeCodesStripColors *this_local;
  
  ~StripAnsiEscapeCodesStripColors(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StripAnsiEscapeCodes, StripColors) {
  // An actual clang warning.
  string input = "\33[1maffixmgr.cxx:286:15: \33[0m\33[0;1;35mwarning: "
                 "\33[0m\33[1musing the result... [-Wparentheses]\33[0m";
  string stripped = StripAnsiEscapeCodes(input);
  EXPECT_EQ("affixmgr.cxx:286:15: warning: using the result... [-Wparentheses]",
            stripped);
}